

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_koblitz(mbedtls_mpi *N,mbedtls_mpi_uint *Rp,size_t p_limbs,size_t adjust,size_t shift,
                   mbedtls_mpi_uint mask)

{
  ulong uVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  mbedtls_mpi R;
  mbedtls_mpi_uint Mp [6];
  mbedtls_mpi local_b0;
  mbedtls_mpi_uint local_98;
  size_t local_90;
  long local_88;
  mbedtls_mpi local_80;
  mbedtls_mpi_uint local_68 [7];
  
  iVar3 = 0;
  if (p_limbs <= N->n) {
    local_80.s = 1;
    local_80.n = 1;
    local_b0.s = 1;
    local_b0.p = local_68;
    uVar5 = N->n - (p_limbs - adjust);
    uVar1 = adjust + p_limbs;
    if (uVar1 <= uVar5) {
      uVar5 = uVar1;
    }
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_88 = p_limbs * 8;
    local_b0.n = uVar5;
    local_98 = mask;
    local_90 = shift;
    local_80.p = Rp;
    memcpy(local_b0.p,N->p + (p_limbs - adjust),uVar5 * 8);
    if ((local_90 == 0) ||
       (iVar3 = mbedtls_mpi_shift_r(&local_b0,local_90), uVar5 = local_b0.n, iVar3 == 0)) {
      local_b0.n = uVar5 + 1;
      if (local_98 != 0) {
        N->p[p_limbs - 1] = N->p[p_limbs - 1] & local_98;
      }
      if (p_limbs < N->n) {
        pmVar2 = N->p;
        sVar4 = p_limbs;
        do {
          pmVar2[sVar4] = 0;
          sVar4 = sVar4 + 1;
        } while (sVar4 < N->n);
      }
      iVar3 = mbedtls_mpi_mul_mpi(&local_b0,&local_b0,&local_80);
      if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_add_abs(N,N,&local_b0), iVar3 == 0)) {
        uVar5 = N->n - (p_limbs - adjust);
        if (uVar1 <= uVar5) {
          uVar5 = uVar1;
        }
        local_68[0] = 0;
        local_68[1] = 0;
        local_68[2] = 0;
        local_68[3] = 0;
        local_68[4] = 0;
        local_68[5] = 0;
        local_b0.n = uVar5;
        memcpy(local_68,(void *)((long)N->p + adjust * -8 + local_88),uVar5 * 8);
        if ((local_90 == 0) ||
           (iVar3 = mbedtls_mpi_shift_r(&local_b0,local_90), uVar5 = local_b0.n, iVar3 == 0)) {
          local_b0.n = uVar5 + local_80.n;
          if (local_98 != 0) {
            N->p[p_limbs - 1] = N->p[p_limbs - 1] & local_98;
          }
          if (p_limbs < N->n) {
            pmVar2 = N->p;
            do {
              pmVar2[p_limbs] = 0;
              p_limbs = p_limbs + 1;
            } while (p_limbs < N->n);
          }
          iVar3 = mbedtls_mpi_mul_mpi(&local_b0,&local_b0,&local_80);
          if (iVar3 == 0) {
            iVar3 = mbedtls_mpi_add_abs(N,N,&local_b0);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static inline int ecp_mod_koblitz( mbedtls_mpi *N, mbedtls_mpi_uint *Rp, size_t p_limbs,
                                   size_t adjust, size_t shift, mbedtls_mpi_uint mask )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi M, R;
    mbedtls_mpi_uint Mp[P_KOBLITZ_MAX + P_KOBLITZ_R + 1];

    if( N->n < p_limbs )
        return( 0 );

    /* Init R */
    R.s = 1;
    R.p = Rp;
    R.n = P_KOBLITZ_R;

    /* Common setup for M */
    M.s = 1;
    M.p = Mp;

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

    /* Second pass */

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}